

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O3

int Ivy_ManFindBoolCut_rec
              (Ivy_Man_t *p,Ivy_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume,Ivy_Obj_t *pPivot)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void **ppvVar5;
  long lVar6;
  
  if (pObj == pPivot) {
    iVar3 = vLeaves->nSize;
    if (0 < (long)iVar3) {
      lVar6 = 0;
      do {
        if ((Ivy_Obj_t *)vLeaves->pArray[lVar6] == pObj) goto LAB_0074fac9;
        lVar6 = lVar6 + 1;
      } while (iVar3 != lVar6);
    }
    if (iVar3 == vLeaves->nCap) {
      if (iVar3 < 0x10) {
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(vLeaves->pArray,0x80);
        }
        vLeaves->pArray = ppvVar5;
        vLeaves->nCap = 0x10;
      }
      else {
        sVar1 = (ulong)(uint)(iVar3 * 2) * 8;
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(sVar1);
        }
        else {
          ppvVar5 = (void **)realloc(vLeaves->pArray,sVar1);
        }
        vLeaves->pArray = ppvVar5;
        vLeaves->nCap = iVar3 * 2;
      }
    }
    else {
      ppvVar5 = vLeaves->pArray;
    }
    iVar3 = vLeaves->nSize;
    vLeaves->nSize = iVar3 + 1;
    ppvVar5[iVar3] = pObj;
LAB_0074fac9:
    iVar3 = vVolume->nSize;
    if (0 < (long)iVar3) {
      lVar6 = 0;
      do {
        if ((Ivy_Obj_t *)vVolume->pArray[lVar6] == pObj) {
          return 1;
        }
        lVar6 = lVar6 + 1;
      } while (iVar3 != lVar6);
    }
  }
  else {
    if ((*(uint *)&pObj->field_0x8 & 0x10) != 0) {
      return 0;
    }
    uVar2 = *(uint *)&pObj->field_0x8 & 0xf;
    if (uVar2 == 1) {
      return 0;
    }
    if (uVar2 == 4) {
      return 0;
    }
    if (uVar2 == 7) {
      iVar3 = Ivy_ManFindBoolCut_rec
                        (p,(Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vLeaves,vVolume,
                         pPivot);
      if (iVar3 == 0) {
        return 0;
      }
      iVar3 = vVolume->nSize;
      if (0 < (long)iVar3) {
        lVar6 = 0;
        do {
          if ((Ivy_Obj_t *)vVolume->pArray[lVar6] == pObj) {
            return 1;
          }
          lVar6 = lVar6 + 1;
        } while (iVar3 != lVar6);
      }
    }
    else {
      if (uVar2 - 7 < 0xfffffffe) {
        __assert_fail("Ivy_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                      ,0xf5,
                      "int Ivy_ManFindBoolCut_rec(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Ivy_Obj_t *)"
                     );
      }
      iVar3 = Ivy_ManFindBoolCut_rec
                        (p,(Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vLeaves,vVolume,
                         pPivot);
      iVar4 = Ivy_ManFindBoolCut_rec
                        (p,(Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vLeaves,vVolume,
                         pPivot);
      if (iVar3 == 0 && iVar4 == 0) {
        return 0;
      }
      if (iVar3 == 0) {
        Vec_PtrPushUnique(vLeaves,(void *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
        Vec_PtrPushUnique(vVolume,(void *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      }
      if (iVar4 == 0) {
        Vec_PtrPushUnique(vLeaves,(void *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
        Vec_PtrPushUnique(vVolume,(void *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      }
      iVar3 = vVolume->nSize;
      if (0 < (long)iVar3) {
        lVar6 = 0;
        do {
          if ((Ivy_Obj_t *)vVolume->pArray[lVar6] == pObj) {
            return 1;
          }
          lVar6 = lVar6 + 1;
        } while (iVar3 != lVar6);
      }
    }
  }
  if (iVar3 == vVolume->nCap) {
    if (iVar3 < 0x10) {
      if (vVolume->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vVolume->pArray,0x80);
      }
      vVolume->pArray = ppvVar5;
      vVolume->nCap = 0x10;
    }
    else {
      sVar1 = (ulong)(uint)(iVar3 * 2) * 8;
      if (vVolume->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(sVar1);
      }
      else {
        ppvVar5 = (void **)realloc(vVolume->pArray,sVar1);
      }
      vVolume->pArray = ppvVar5;
      vVolume->nCap = iVar3 * 2;
    }
  }
  else {
    ppvVar5 = vVolume->pArray;
  }
  iVar3 = vVolume->nSize;
  vVolume->nSize = iVar3 + 1;
  ppvVar5[iVar3] = pObj;
  return 1;
}

Assistant:

int Ivy_ManFindBoolCut_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume, Ivy_Obj_t * pPivot )
{
    int RetValue0, RetValue1;
    if ( pObj == pPivot )
    {
        Vec_PtrPushUnique( vLeaves, pObj );
        Vec_PtrPushUnique( vVolume, pObj );
        return 1;        
    }
    if ( pObj->fMarkA )
        return 0;

//    assert( !Ivy_ObjIsCi(pObj) );
    if ( Ivy_ObjIsCi(pObj) )
        return 0;

    if ( Ivy_ObjIsBuf(pObj) )
    {
        RetValue0 = Ivy_ManFindBoolCut_rec( p, Ivy_ObjFanin0(pObj), vLeaves, vVolume, pPivot );
        if ( !RetValue0 )
            return 0;
        Vec_PtrPushUnique( vVolume, pObj );
        return 1;
    }
    assert( Ivy_ObjIsNode(pObj) );
    RetValue0 = Ivy_ManFindBoolCut_rec( p, Ivy_ObjFanin0(pObj), vLeaves, vVolume, pPivot );
    RetValue1 = Ivy_ManFindBoolCut_rec( p, Ivy_ObjFanin1(pObj), vLeaves, vVolume, pPivot );
    if ( !RetValue0 && !RetValue1 )
        return 0;
    // add new leaves
    if ( !RetValue0 )
    {
        Vec_PtrPushUnique( vLeaves, Ivy_ObjFanin0(pObj) );
        Vec_PtrPushUnique( vVolume, Ivy_ObjFanin0(pObj) );
    }
    if ( !RetValue1 )
    {
        Vec_PtrPushUnique( vLeaves, Ivy_ObjFanin1(pObj) );
        Vec_PtrPushUnique( vVolume, Ivy_ObjFanin1(pObj) );
    }
    Vec_PtrPushUnique( vVolume, pObj );
    return 1;
}